

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void __thiscall CDevice::AddPage(CDevice *this,byte *memory,int32_t size)

{
  CDevicePage *this_00;
  int32_t size_local;
  byte *memory_local;
  CDevice *this_local;
  
  if (this->PagesCount == 0x400) {
    ErrorInt("Can\'t add more pages, already at max",0x400,FATAL);
  }
  this_00 = (CDevicePage *)operator_new(0x10);
  CDevicePage::CDevicePage(this_00,memory,size,this->PagesCount);
  this->Pages[this->PagesCount] = this_00;
  this->PagesCount = this->PagesCount + 1;
  return;
}

Assistant:

void CDevice::AddPage(byte* memory, int32_t size) {
	if (CDeviceDef::MAX_PAGE_N == PagesCount) ErrorInt("Can't add more pages, already at max", CDeviceDef::MAX_PAGE_N, FATAL);
	Pages[PagesCount] = new CDevicePage(memory, size, PagesCount);
	PagesCount++;
}